

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

NumericExpr __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
::ReadNumericExpr(NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                  *this,int opcode)

{
  Kind kind;
  Kind KVar1;
  NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *pNVar2;
  PLTermHandler PVar3;
  int iVar4;
  OpCodeInfo *pOVar5;
  LogicalExpr condition;
  NumericExpr else_expr;
  NumericExpr NVar6;
  NumericExpr NVar7;
  Reference arg;
  CountExpr CVar8;
  Expr arg0;
  ExprBase EVar9;
  int iVar10;
  bool bVar11;
  double dVar12;
  NumericArgHandler NVar13;
  VarArgHandler VVar14;
  SymbolicArgHandler SVar15;
  NumberOfArgHandler NVar16;
  PLTermHandler pl_handler;
  
  pOVar5 = GetOpCodeInfo(opcode);
  kind = pOVar5->kind;
  KVar1 = pOVar5->first_kind;
  switch(KVar1) {
  case IF:
    condition = ReadLogicalExpr(this);
    NVar6 = ReadNumericExpr(this,false);
    else_expr = ReadNumericExpr(this,false);
    NVar7 = NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::OnIf
                      (this->handler_,(LogicalExpr)condition.super_ExprBase.impl_,
                       (NumericExpr)NVar6.super_ExprBase.impl_,
                       (NumericExpr)else_expr.super_ExprBase.impl_);
    return (NumericExpr)NVar7.super_ExprBase.impl_;
  case PLTERM:
    iVar4 = BinaryReader<mp::internal::IdentityConverter>::ReadUInt(this->reader_);
    if (iVar4 < 2) {
      BinaryReaderBase::ReportError<>(&this->reader_->super_BinaryReaderBase,(CStringRef)0x15a538);
    }
    iVar4 = iVar4 + -1;
    pl_handler = NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::BeginPLTerm
                           (this->handler_,iVar4);
    iVar10 = 0;
    if (0 < iVar4) {
      iVar10 = iVar4;
    }
    while( true ) {
      dVar12 = ReadConstant(this);
      BasicExprFactory<std::allocator<char>_>::PLTermBuilder::AddSlope(&pl_handler,dVar12);
      PVar3 = pl_handler;
      bVar11 = iVar10 == 0;
      iVar10 = iVar10 + -1;
      if (bVar11) break;
      dVar12 = ReadConstant(this);
      BasicExprFactory<std::allocator<char>_>::PLTermBuilder::AddBreakpoint(&pl_handler,dVar12);
    }
    pNVar2 = this->handler_;
    arg = ReadReference(this);
    EVar9.impl_ = (Impl *)NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::
                          EndPLTerm(pNVar2,PVar3,
                                    (Reference)
                                    arg.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.
                                    super_ExprBase.impl_);
    break;
  case FIRST_ITERATED:
    iVar4 = ReadNumArgs(this,1);
    VVar14 = NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::BeginVarArg
                       (this->handler_,kind,iVar4);
    pl_handler._0_12_ = VVar14._0_12_;
    NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
    ::
    DoReadArgs<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>::NumericExprReader,mp::BasicExprFactory<std::allocator<char>>::BasicIteratedExprBuilder<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)42,(mp::expr::Kind)45>>>
              ((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
                *)this,iVar4,
               (BasicIteratedExprBuilder<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>_>
                *)&pl_handler);
    PVar3 = pl_handler;
    VVar14._12_4_ = 0;
    VVar14.impl_ = (Impl *)pl_handler.impl_;
    VVar14.arg_index_ = pl_handler.slope_index_;
    pl_handler = PVar3;
    EVar9.impl_ = (Impl *)NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::
                          EndVarArg(this->handler_,VVar14);
    break;
  case SUM:
    iVar4 = ReadNumArgs(this,3);
    NVar13 = NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::BeginSum
                       (this->handler_,iVar4);
    pl_handler._0_12_ = NVar13._0_12_;
    NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
    ::
    DoReadArgs<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>::NumericExprReader,mp::BasicExprFactory<std::allocator<char>>::BasicIteratedExprBuilder<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)42,(mp::expr::Kind)45>>>
              ((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
                *)this,iVar4,
               (BasicIteratedExprBuilder<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>_>
                *)&pl_handler);
    PVar3 = pl_handler;
    NVar13._12_4_ = 0;
    NVar13.impl_ = (Impl *)pl_handler.impl_;
    NVar13.arg_index_ = pl_handler.slope_index_;
    pl_handler = PVar3;
    EVar9.impl_ = (Impl *)NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::EndSum
                                    (this->handler_,NVar13);
    break;
  case LAST_ITERATED:
    iVar4 = ReadNumArgs(this,1);
    pNVar2 = this->handler_;
    NVar6 = ReadNumericExpr(this,false);
    NVar16 = NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::BeginNumberOf
                       (pNVar2,iVar4,(NumericExpr)NVar6.super_ExprBase.impl_);
    pl_handler._0_12_ = NVar16._0_12_;
    NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
    ::
    DoReadArgs<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>::NumericExprReader,mp::BasicExprFactory<std::allocator<char>>::BasicIteratedExprBuilder<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)42,(mp::expr::Kind)45>>>
              ((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
                *)this,iVar4 + -1,
               (BasicIteratedExprBuilder<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>_>
                *)&pl_handler);
    PVar3 = pl_handler;
    NVar16._12_4_ = 0;
    NVar16.impl_ = (Impl *)pl_handler.impl_;
    NVar16.arg_index_ = pl_handler.slope_index_;
    pl_handler = PVar3;
    EVar9.impl_ = (Impl *)NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::
                          EndNumberOf(this->handler_,NVar16);
    break;
  case NUMBEROF_SYM:
    iVar4 = ReadNumArgs(this,1);
    pNVar2 = this->handler_;
    arg0 = ReadSymbolicExpr(this);
    SVar15 = NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::
             BeginSymbolicNumberOf(pNVar2,iVar4,(Expr)arg0.super_ExprBase.impl_);
    pl_handler._0_12_ = SVar15._0_12_;
    NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
    ::
    DoReadArgs<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>::SymbolicExprReader,mp::BasicExprFactory<std::allocator<char>>::BasicIteratedExprBuilder<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>,(mp::expr::Kind)46,(mp::expr::Kind)46>>>
              ((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
                *)this,iVar4 + -1,
               (BasicIteratedExprBuilder<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>,_(mp::expr::Kind)46,_(mp::expr::Kind)46>_>
                *)&pl_handler);
    PVar3 = pl_handler;
    SVar15._12_4_ = 0;
    SVar15.impl_ = (Impl *)pl_handler.impl_;
    SVar15.arg_index_ = pl_handler.slope_index_;
    pl_handler = PVar3;
    EVar9.impl_ = (Impl *)NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::
                          EndSymbolicNumberOf(this->handler_,SVar15);
    break;
  case COUNT:
    CVar8 = ReadCountExpr(this);
    return (NumericExpr)
           CVar8.super_BasicExpr<(mp::expr::Kind)47,_(mp::expr::Kind)47>.super_ExprBase.impl_;
  default:
    if (KVar1 == ADD) {
      BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>::NumericExprReader>
      ::BinaryArgReader((BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>::NumericExprReader>
                         *)&pl_handler,this);
      NVar7 = NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::OnBinary
                        (this->handler_,kind,(NumericExpr)pl_handler.impl_,
                         (NumericExpr)pl_handler._8_8_);
      return (NumericExpr)(Impl *)NVar7.super_ExprBase.impl_;
    }
    if (KVar1 == FIRST_UNARY) {
      pNVar2 = this->handler_;
      NVar6 = ReadNumericExpr(this,false);
      NVar7 = NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::OnUnary
                        (pNVar2,kind,(NumericExpr)NVar6.super_ExprBase.impl_);
      return (NumericExpr)NVar7.super_ExprBase.impl_;
    }
  case CALL:
  case LAST_VARARG:
    BinaryReaderBase::ReportError<>(&this->reader_->super_BinaryReaderBase,(CStringRef)0x15a560);
    EVar9.impl_ = (Impl *)0x0;
  }
  return (NumericExpr)EVar9.impl_;
}

Assistant:

typename Handler::NumericExpr
    NLReader<Reader, Handler>::ReadNumericExpr(int opcode) {
  const internal::OpCodeInfo &info = internal::GetOpCodeInfo(opcode);
  expr::Kind kind = info.kind;
  switch (info.first_kind) {
  case expr::FIRST_UNARY:
    return handler_.OnUnary(kind, ReadNumericExpr());
  case expr::FIRST_BINARY: {
    BinaryArgReader<> args(*this);
    return handler_.OnBinary(kind, args.lhs, args.rhs);
  }
  case expr::IF: {
    LogicalExpr condition = ReadLogicalExpr();
    NumericExpr then_expr = ReadNumericExpr();
    NumericExpr else_expr = ReadNumericExpr();
    return handler_.OnIf(condition, then_expr, else_expr);
  }
  case expr::PLTERM: {
    // Read a piecewise-linear term.
    int num_slopes = reader_.ReadUInt();
    if (num_slopes <= 1)
      reader_.ReportError("too few slopes in piecewise-linear term");
    reader_.ReadTillEndOfLine();
    typename Handler::PLTermHandler pl_handler =
        handler_.BeginPLTerm(num_slopes - 1);
    for (int i = 0; i < num_slopes - 1; ++i) {
      pl_handler.AddSlope(ReadConstant());
      pl_handler.AddBreakpoint(ReadConstant());
    }
    pl_handler.AddSlope(ReadConstant());
    return handler_.EndPLTerm(pl_handler, ReadReference());
  }
  case expr::FIRST_VARARG: {
    // Read a vararg expression (min or max).
    int num_args = ReadNumArgs(1);
    typename Handler::VarArgHandler args = handler_.BeginVarArg(kind, num_args);
    ReadArgs<NumericExprReader>(num_args, args);
    return handler_.EndVarArg(args);
  }
  case expr::SUM: {
    int num_args = ReadNumArgs();
    typename Handler::NumericArgHandler args = handler_.BeginSum(num_args);
    ReadArgs<NumericExprReader>(num_args, args);
    return handler_.EndSum(args);
  }
  case expr::COUNT:
    return ReadCountExpr();
  case expr::NUMBEROF: {
    // Read a numberof expression.
    int num_args = ReadNumArgs(1);
    reader_.ReadTillEndOfLine();
    typename Handler::NumberOfArgHandler args =
        handler_.BeginNumberOf(num_args, ReadNumericExpr());
    DoReadArgs<NumericExprReader>(num_args - 1, args);
    return handler_.EndNumberOf(args);
  }
  case expr::NUMBEROF_SYM: {
    // Read a symbolic numberof expression.
    int num_args = ReadNumArgs(1);
    reader_.ReadTillEndOfLine();
    typename Handler::SymbolicArgHandler args =
        handler_.BeginSymbolicNumberOf(num_args, ReadSymbolicExpr());
    DoReadArgs<SymbolicExprReader>(num_args - 1, args);
    return handler_.EndSymbolicNumberOf(args);
  }
  default:
    reader_.ReportError("expected numeric expression opcode");
  }
  return NumericExpr();
}